

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# base_swap.h
# Opt level: O2

void __thiscall
Gudhi::persistence_matrix::
Base_swap<Gudhi::persistence_matrix::Matrix<RU_vine_options<(Gudhi::persistence_matrix::Column_types)7,_false,_false,_true,_false,_true>_>,_Gudhi::persistence_matrix::Base_matrix<Gudhi::persistence_matrix::Matrix<RU_vine_options<(Gudhi::persistence_matrix::Column_types)7,_false,_false,_true,_false,_true>_>_>_>
::Base_swap(Base_swap<Gudhi::persistence_matrix::Matrix<RU_vine_options<(Gudhi::persistence_matrix::Column_types)7,_false,_false,_true,_false,_true>_>,_Gudhi::persistence_matrix::Base_matrix<Gudhi::persistence_matrix::Matrix<RU_vine_options<(Gudhi::persistence_matrix::Column_types)7,_false,_false,_true,_false,_true>_>_>_>
            *this,uint numberOfColumns)

{
  pointer puVar1;
  pointer puVar2;
  ulong __n;
  Index i;
  ulong uVar3;
  allocator_type local_12;
  allocator_type local_11;
  
  __n = (ulong)numberOfColumns;
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector(&this->indexToRow_,__n,&local_11)
  ;
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector(&this->rowToIndex_,__n,&local_12)
  ;
  this->rowSwapped_ = false;
  puVar1 = (this->indexToRow_).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
           _M_impl.super__Vector_impl_data._M_start;
  puVar2 = (this->rowToIndex_).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
           _M_impl.super__Vector_impl_data._M_start;
  for (uVar3 = 0; __n != uVar3; uVar3 = uVar3 + 1) {
    puVar1[uVar3] = (uint)uVar3;
    puVar2[uVar3] = (uint)uVar3;
  }
  return;
}

Assistant:

inline Base_swap<Master_matrix, Base_matrix>::Base_swap(unsigned int numberOfColumns)
    : indexToRow_(numberOfColumns), rowToIndex_(numberOfColumns), rowSwapped_(false)
{
  for (Index i = 0; i < numberOfColumns; i++) {
    indexToRow_[i] = i;
    rowToIndex_[i] = i;
  }
}